

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

vector3d * tinyusdz::transform(vector3d *__return_storage_ptr__,matrix4d *m,vector3d *p)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  vector3d *in_RCX;
  
  dVar1 = m->m[3][2];
  dVar3 = m->m[3][0];
  dVar4 = m->m[3][1];
  value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::vector3d,double,double,3ul>
            (__return_storage_ptr__,(value *)m,(matrix4d *)p,in_RCX);
  dVar3 = __return_storage_ptr__->x + dVar3;
  dVar4 = __return_storage_ptr__->y + dVar4;
  auVar2._8_4_ = SUB84(dVar4,0);
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
  __return_storage_ptr__->x = dVar3;
  __return_storage_ptr__->y = (double)auVar2._8_8_;
  __return_storage_ptr__->z = dVar1 + __return_storage_ptr__->z;
  return __return_storage_ptr__;
}

Assistant:

value::vector3d transform(const value::matrix4d &m, const value::vector3d &p) {
  value::vector3d tx{m.m[3][0], m.m[3][1], m.m[3][2]};
  value::vector3d v =
      value::MultV<value::matrix4d, value::vector3d, double, double, 3>(m, p);
  v.x += tx.x;
  v.y += tx.y;
  v.z += tx.z;
  return v;
}